

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O1

bool testing::internal::ParseGoogleMockStringFlag<std::__cxx11::string>
               (char *str,char *flag,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  undefined8 uVar1;
  char *__s;
  
  __s = ParseGoogleMockFlagValue(str,"verbose",false);
  uVar1 = FLAGS_gmock_verbose_abi_cxx11_._8_8_;
  if (__s != (char *)0x0) {
    strlen(__s);
    std::__cxx11::string::_M_replace(0x3ae6b0,0,(char *)uVar1,(ulong)__s);
  }
  return __s != (char *)0x0;
}

Assistant:

static bool ParseGoogleMockStringFlag(const char* str, const char* flag,
                                      String* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}